

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

void __thiscall
Qentem::BigInt<unsigned_long_long,_1024U>::Add
          (BigInt<unsigned_long_long,_1024U> *this,unsigned_long_long number,SizeT32 index)

{
  ulong uVar1;
  SizeT32 SVar2;
  unsigned_long_long tmp;
  unsigned_long_long uStack_18;
  SizeT32 index_local;
  unsigned_long_long number_local;
  BigInt<unsigned_long_long,_1024U> *this_local;
  
  tmp._4_4_ = index;
  uStack_18 = number;
  if (number != 0) {
    for (; (SVar2 = MaxIndex(), tmp._4_4_ <= SVar2 &&
           (uVar1 = this->storage_[tmp._4_4_],
           this->storage_[tmp._4_4_] = uStack_18 + this->storage_[tmp._4_4_],
           this->storage_[tmp._4_4_] <= uVar1)); tmp._4_4_ = tmp._4_4_ + 1) {
      uStack_18 = 1;
    }
    SVar2 = MaxIndex();
    if (SVar2 < tmp._4_4_) {
      this->index_ = 0;
    }
    else if (this->index_ < tmp._4_4_) {
      this->index_ = tmp._4_4_;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }